

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O1

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrCompositionLayerEquirectKHR *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  XrCompositionLayerEquirectKHR *pXVar2;
  byte bVar3;
  XrStructureType XVar4;
  XrEyeVisibility XVar5;
  pointer pcVar6;
  PFN_xrStructureTypeToString p_Var7;
  void *value_00;
  XrStructureType __val;
  XrEyeVisibility __val_00;
  uint uVar8;
  char cVar9;
  bool bVar10;
  char *pcVar11;
  XrInstance pXVar12;
  invalid_argument *piVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  char cVar19;
  XrGeneratedDispatchTable *pXVar20;
  string scale_prefix;
  string pose_prefix;
  string subimage_prefix;
  string next_prefix;
  string type_prefix;
  string eyevisibility_prefix;
  string space_prefix;
  string layerflags_prefix;
  string bias_prefix;
  string radius_prefix;
  ostringstream oss_space;
  ostringstream oss_radius;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  long *local_568;
  long local_560;
  long local_558 [2];
  long *local_548;
  long local_540;
  long local_538 [2];
  long *local_528;
  long local_520;
  long local_518 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  long *local_488;
  long local_480;
  long local_478 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  undefined1 local_448 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_438;
  string local_428;
  undefined1 local_408 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8;
  string local_3e8;
  undefined1 local_3c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  string local_3a8;
  undefined1 local_388 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  string local_368;
  string local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  PFN_xrCreateSwapchain local_308;
  PFN_xrCreateAction p_Stack_300;
  PFN_xrLocateSpace local_2f8;
  PFN_xrAcquireSwapchainImage p_Stack_2f0;
  ios_base local_2b8 [272];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  local_1a8._0_8_ = value;
  std::__cxx11::string::_M_construct((ulong)&local_328,'\x12');
  *local_328._M_dataplus._M_p = '0';
  local_328._M_dataplus._M_p[1] = 'x';
  pcVar11 = local_328._M_dataplus._M_p + local_328._M_string_length + -1;
  lVar15 = 0;
  do {
    bVar3 = local_1a8[lVar15];
    *pcVar11 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar3 & 0xf];
    pcVar11[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar3 >> 4];
    lVar15 = lVar15 + 1;
    pcVar11 = pcVar11 + -2;
  } while (lVar15 != 8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,&local_328);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)prefix);
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  pcVar6 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_508,pcVar6,pcVar6 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_508);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    XVar4 = value->type;
    __val = -XVar4;
    if (0 < (int)XVar4) {
      __val = XVar4;
    }
    uVar18 = 1;
    if (XR_TYPE_SWAPCHAIN_CREATE_INFO < __val) {
      uVar17 = (ulong)__val;
      uVar8 = 4;
      do {
        uVar18 = uVar8;
        uVar14 = (uint)uVar17;
        if (uVar14 < 100) {
          uVar18 = uVar18 - 2;
          goto LAB_001360ed;
        }
        if (uVar14 < 1000) {
          uVar18 = uVar18 - 1;
          goto LAB_001360ed;
        }
        if (uVar14 < 10000) goto LAB_001360ed;
        uVar17 = uVar17 / 10000;
        uVar8 = uVar18 + 4;
      } while (99999 < uVar14);
      uVar18 = uVar18 + 1;
    }
LAB_001360ed:
    local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_328,(char)uVar18 - (char)((int)XVar4 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_328._M_dataplus._M_p + (XVar4 >> 0x1f),uVar18,__val);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_508,&local_328);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_2f8 = (PFN_xrLocateSpace)0x0;
    p_Stack_2f0 = (PFN_xrAcquireSwapchainImage)0x0;
    local_308 = (PFN_xrCreateSwapchain)0x0;
    p_Stack_300 = (PFN_xrCreateAction)0x0;
    local_328.field_2._M_allocated_capacity = 0;
    local_328.field_2._8_8_ = 0;
    local_328._M_dataplus._M_p = (pointer)0x0;
    local_328._M_string_length = 0;
    p_Var7 = gen_dispatch_table->StructureTypeToString;
    pXVar12 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var7)(pXVar12,value->type,(char *)&local_328);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_508,(char (*) [64])&local_328);
  }
  local_528 = local_518;
  pcVar6 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_528,pcVar6,pcVar6 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_528);
  value_00 = value->next;
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_348,local_528,local_520 + (long)local_528);
  bVar10 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_348,contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  if (!bVar10) {
    piVar13 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar13,"Invalid Operation");
    __cxa_throw(piVar13,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
  pcVar6 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4a8,pcVar6,pcVar6 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_4a8);
  uVar17 = value->layerFlags;
  cVar19 = '\x01';
  if (9 < uVar17) {
    uVar16 = uVar17;
    cVar9 = '\x04';
    do {
      cVar19 = cVar9;
      if (uVar16 < 100) {
        cVar19 = cVar19 + -2;
        goto LAB_0013629c;
      }
      if (uVar16 < 1000) {
        cVar19 = cVar19 + -1;
        goto LAB_0013629c;
      }
      if (uVar16 < 10000) goto LAB_0013629c;
      bVar10 = 99999 < uVar16;
      uVar16 = uVar16 / 10000;
      cVar9 = cVar19 + '\x04';
    } while (bVar10);
    cVar19 = cVar19 + '\x01';
  }
LAB_0013629c:
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_328,cVar19);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_328._M_dataplus._M_p,(uint)local_328._M_string_length,uVar17);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[24],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [24])"XrCompositionLayerFlags",&local_4a8,&local_328);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
  pcVar6 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4c8,pcVar6,pcVar6 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_4c8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_328);
  *(uint *)((long)&local_328.field_2 + *(long *)(local_328._M_dataplus._M_p + -0x18) + 8) =
       *(uint *)((long)&local_328.field_2 + *(long *)(local_328._M_dataplus._M_p + -0x18) + 8) &
       0xffffffb5 | 8;
  std::ostream::_M_insert<void_const*>(&local_328);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[8],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [8])"XrSpace",&local_4c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
  pXVar2 = (XrCompositionLayerEquirectKHR *)(local_1a8 + 0x10);
  if ((XrCompositionLayerEquirectKHR *)local_1a8._0_8_ != pXVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
  pcVar6 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4e8,pcVar6,pcVar6 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_4e8);
  XVar5 = value->eyeVisibility;
  __val_00 = -XVar5;
  if (0 < (int)XVar5) {
    __val_00 = XVar5;
  }
  uVar18 = 1;
  if (9 < __val_00) {
    uVar17 = (ulong)__val_00;
    uVar8 = 4;
    do {
      uVar18 = uVar8;
      uVar14 = (uint)uVar17;
      if (uVar14 < 100) {
        uVar18 = uVar18 - 2;
        goto LAB_00136457;
      }
      if (uVar14 < 1000) {
        uVar18 = uVar18 - 1;
        goto LAB_00136457;
      }
      if (uVar14 < 10000) goto LAB_00136457;
      uVar17 = uVar17 / 10000;
      uVar8 = uVar18 + 4;
    } while (99999 < uVar14);
    uVar18 = uVar18 + 1;
  }
LAB_00136457:
  local_1a8._0_8_ = pXVar2;
  std::__cxx11::string::_M_construct((ulong)local_1a8,(char)uVar18 - (char)((int)XVar5 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)(local_1a8._0_8_ + (ulong)(XVar5 >> 0x1f)),uVar18,__val_00);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [16])"XrEyeVisibility",&local_4e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
  if ((XrCompositionLayerEquirectKHR *)local_1a8._0_8_ != pXVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_548 = local_538;
  pcVar6 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_548,pcVar6,pcVar6 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_548);
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_368,local_548,local_540 + (long)local_548);
  pXVar20 = (XrGeneratedDispatchTable *)local_388;
  local_388._0_8_ = local_388 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)pXVar20,"XrSwapchainSubImage","");
  bVar10 = ApiDumpOutputXrStruct
                     (pXVar20,&value->subImage,&local_368,(string *)local_388,false,contents);
  if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
    operator_delete((void *)local_388._0_8_,(ulong)(local_378._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  if (!bVar10) {
    piVar13 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar13,"Invalid Operation");
    __cxa_throw(piVar13,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_568 = local_558;
  pcVar6 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_568,pcVar6,pcVar6 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_568);
  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3a8,local_568,local_560 + (long)local_568);
  pXVar20 = (XrGeneratedDispatchTable *)local_3c8;
  local_3c8._0_8_ = local_3c8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)pXVar20,"XrPosef","");
  bVar10 = ApiDumpOutputXrStruct(pXVar20,&value->pose,&local_3a8,(string *)local_3c8,false,contents)
  ;
  if ((undefined1 *)local_3c8._0_8_ != local_3c8 + 0x10) {
    operator_delete((void *)local_3c8._0_8_,(ulong)(local_3b8._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  if (!bVar10) {
    piVar13 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar13,"Invalid Operation");
    __cxa_throw(piVar13,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pcVar6 = (prefix->_M_dataplus)._M_p;
  local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_468,pcVar6,pcVar6 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_468);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  *(undefined8 *)(local_1a8 + *(long *)(local_1a8._0_8_ + -0x18) + 8) = 0x20;
  std::ostream::_M_insert<double>((double)value->radius);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [6])"float",&local_468,&local_588);
  paVar1 = &local_588.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != paVar1) {
    operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
  }
  pcVar6 = (prefix->_M_dataplus)._M_p;
  local_588._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_588,pcVar6,pcVar6 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_588);
  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3e8,local_588._M_dataplus._M_p,
             local_588._M_dataplus._M_p + local_588._M_string_length);
  pXVar20 = (XrGeneratedDispatchTable *)local_408;
  local_408._0_8_ = local_408 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)pXVar20,"XrVector2f","");
  bVar10 = ApiDumpOutputXrStruct
                     (pXVar20,&value->scale,&local_3e8,(string *)local_408,false,contents);
  if ((undefined1 *)local_408._0_8_ != local_408 + 0x10) {
    operator_delete((void *)local_408._0_8_,(ulong)(local_3f8._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  if (bVar10) {
    pcVar6 = (prefix->_M_dataplus)._M_p;
    local_488 = local_478;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_488,pcVar6,pcVar6 + prefix->_M_string_length);
    std::__cxx11::string::append((char *)&local_488);
    local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_428,local_488,local_480 + (long)local_488);
    pXVar20 = (XrGeneratedDispatchTable *)local_448;
    local_448._0_8_ = local_448 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)pXVar20,"XrVector2f","");
    bVar10 = ApiDumpOutputXrStruct
                       (pXVar20,&value->bias,&local_428,(string *)local_448,false,contents);
    if ((undefined1 *)local_448._0_8_ != local_448 + 0x10) {
      operator_delete((void *)local_448._0_8_,(ulong)(local_438._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p != &local_428.field_2) {
      operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
    }
    if (bVar10) {
      if (local_488 != local_478) {
        operator_delete(local_488,local_478[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_588._M_dataplus._M_p != paVar1) {
        operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_dataplus._M_p != &local_468.field_2) {
        operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
      }
      if (local_568 != local_558) {
        operator_delete(local_568,local_558[0] + 1);
      }
      if (local_548 != local_538) {
        operator_delete(local_548,local_538[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
        operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_328);
      std::ios_base::~ios_base(local_2b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
        operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
        operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
      }
      if (local_528 != local_518) {
        operator_delete(local_528,local_518[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_508._M_dataplus._M_p != &local_508.field_2) {
        operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
      }
      return true;
    }
    piVar13 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar13,"Invalid Operation");
    __cxa_throw(piVar13,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  piVar13 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar13,"Invalid Operation");
  __cxa_throw(piVar13,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrCompositionLayerEquirectKHR* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string layerflags_prefix = prefix;
        layerflags_prefix += "layerFlags";
        contents.emplace_back("XrCompositionLayerFlags", layerflags_prefix, std::to_string(value->layerFlags));
        std::string space_prefix = prefix;
        space_prefix += "space";
        std::ostringstream oss_space;
        oss_space << std::hex << reinterpret_cast<const void*>(value->space);
        contents.emplace_back("XrSpace", space_prefix, oss_space.str());
        std::string eyevisibility_prefix = prefix;
        eyevisibility_prefix += "eyeVisibility";
        contents.emplace_back("XrEyeVisibility", eyevisibility_prefix, std::to_string(value->eyeVisibility));
        std::string subimage_prefix = prefix;
        subimage_prefix += "subImage";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->subImage, subimage_prefix, "XrSwapchainSubImage", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string pose_prefix = prefix;
        pose_prefix += "pose";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->pose, pose_prefix, "XrPosef", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string radius_prefix = prefix;
        radius_prefix += "radius";
        std::ostringstream oss_radius;
        oss_radius << std::setprecision(32) << (value->radius);
        contents.emplace_back("float", radius_prefix, oss_radius.str());
        std::string scale_prefix = prefix;
        scale_prefix += "scale";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->scale, scale_prefix, "XrVector2f", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string bias_prefix = prefix;
        bias_prefix += "bias";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->bias, bias_prefix, "XrVector2f", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        return true;
    } catch(...) {
    }
    return false;
}